

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * util::lowercase(string *__return_storage_ptr__,string *subject)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  string *subject_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::length();
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  __result._M_current = (char *)std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
            (__first,__last,__result,tolower);
  return __return_storage_ptr__;
}

Assistant:

std::string lowercase(const std::string& subject)
{
	std::string result;
	result.resize(subject.length());

	std::transform(subject.begin(), subject.end(), result.begin(), static_cast<int(*)(int)>(std::tolower));

	return result;
}